

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  MessageLite MVar1;
  Tables *pTVar2;
  size_t __n;
  DescriptorPool *pDVar3;
  pointer pcVar4;
  Message *pMVar5;
  MessageLite *this_00;
  int iVar6;
  int iVar7;
  pointer pbVar8;
  LogMessage *pLVar9;
  FileDescriptor *pFVar10;
  SourceCodeInfo *this_01;
  FileDescriptorTables *pFVar11;
  string *psVar12;
  void *pvVar13;
  undefined8 *puVar14;
  long *plVar15;
  pointer pOVar16;
  undefined4 extraout_var;
  FieldDescriptor *pFVar17;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  size_t sVar18;
  _func_int **pp_Var19;
  long lVar20;
  void *extraout_RDX;
  void *extraout_RDX_00;
  int iVar21;
  long lVar22;
  ulong uVar23;
  pointer pOVar24;
  SourceCodeInfo *from;
  FileOptions *orig_options;
  ulong uVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  pointer pOVar27;
  bool bVar28;
  const_iterator cVar29;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar30;
  string buf;
  size_type __dnew;
  size_type __dnew_1;
  FileDescriptorProto existing_proto;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen_dependencies;
  FileDescriptor *local_3e0;
  string local_3d0;
  undefined1 local_3b0 [16];
  string local_3a0;
  size_type local_378;
  pointer local_370;
  undefined1 local_368 [56];
  undefined1 local_330 [24];
  DynamicMessageFactory local_318 [4];
  size_t local_260;
  LogMessage local_258;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  LogMessage local_1f0;
  LogMessage local_1b8;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  pTVar2 = this->tables_;
  local_330._0_8_ = (this->filename_)._M_dataplus._M_p;
  cVar29 = std::tr1::
           _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
           ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                   *)&pTVar2->files_by_name_,(key_type *)local_330);
  if (cVar29.
      super__Hashtable_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_false>
      ._M_cur_node ==
      (pTVar2->files_by_name_).
      super_unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>_>
      .
      super___unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_false>
      .
      super__Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
      ._M_buckets
      [(pTVar2->files_by_name_).
       super_unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>_>
       .
       super___unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_false>
       .
       super__Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
       ._M_bucket_count]) {
    local_3e0 = (FileDescriptor *)0x0;
  }
  else {
    local_3e0 = ((cVar29.
                  super__Hashtable_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_false>
                 ._M_cur_node)->_M_v).second;
  }
  if (local_3e0 != (FileDescriptor *)0x0) {
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_330);
    FileDescriptor::CopyTo(local_3e0,(FileDescriptorProto *)local_330);
    MessageLite::SerializeAsString_abi_cxx11_((string *)local_3b0,(MessageLite *)local_330);
    MessageLite::SerializeAsString_abi_cxx11_((string *)local_368,(MessageLite *)proto);
    if (local_3b0._8_8_ == local_368._8_8_) {
      if ((pointer)local_3b0._8_8_ == (pointer)0x0) {
        bVar28 = true;
      }
      else {
        iVar6 = bcmp((void *)local_3b0._0_8_,(void *)local_368._0_8_,local_3b0._8_8_);
        bVar28 = iVar6 == 0;
      }
    }
    else {
      bVar28 = false;
    }
    if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
      operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
    }
    if ((string *)local_3b0._0_8_ != &local_3a0) {
      operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._M_dataplus._M_p + 1));
    }
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_330);
    if (bVar28) {
      return local_3e0;
    }
  }
  pbVar8 = (this->tables_->pending_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar22 = (long)(this->tables_->pending_files_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8;
  bVar28 = lVar22 != 0;
  if (bVar28) {
    uVar23 = lVar22 >> 5;
    local_370 = (pointer)proto->name_;
    sVar18 = (local_370->name_scope)._M_string_length;
    bVar28 = true;
    lVar22 = 8;
    uVar25 = 0;
    local_260 = sVar18;
LAB_001d28db:
    __n = *(size_t *)((long)&(pbVar8->_M_dataplus)._M_p + lVar22);
    if ((__n != sVar18) ||
       ((__n != 0 &&
        (iVar6 = bcmp(*(void **)((long)pbVar8 + lVar22 + -8),
                      (local_370->name_scope)._M_dataplus._M_p,__n), sVar18 = local_260, iVar6 != 0)
        ))) goto LAB_001d290b;
    local_330._0_8_ = local_330 + 0x10;
    local_3b0._0_8_ = (string *)0x21;
    local_330._0_8_ = std::__cxx11::string::_M_create((ulong *)local_330,(ulong)local_3b0);
    local_330._16_8_ = local_3b0._0_8_;
    *(undefined8 *)(local_330._0_8_ + 0x10) = 0x7374726f706d6920;
    *(undefined8 *)(local_330._0_8_ + 0x18) = 0x3a666c6573746920;
    *(undefined8 *)local_330._0_8_ = 0x63657220656c6946;
    *(undefined8 *)(local_330._0_8_ + 8) = 0x796c657669737275;
    *(char *)(local_330._0_8_ + 0x20) = ' ';
    local_330._8_8_ = local_3b0._0_8_;
    *(char *)(local_330._0_8_ + local_3b0._0_8_) = '\0';
    pbVar8 = (this->tables_->pending_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((uVar25 & 0xffffffff) <
        (ulong)((long)(this->tables_->pending_files_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)) {
      do {
        std::__cxx11::string::_M_append(local_330,*(ulong *)((long)pbVar8 + lVar22 + -8));
        std::__cxx11::string::append(local_330);
        uVar25 = uVar25 + 1;
        pbVar8 = (this->tables_->pending_files_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar22 = lVar22 + 0x20;
      } while (uVar25 < (ulong)((long)(this->tables_->pending_files_).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5
                               ));
    }
    std::__cxx11::string::_M_append(local_330,(ulong)(proto->name_->_M_dataplus)._M_p);
    AddError(this,proto->name_,&proto->super_Message,OTHER,(string *)local_330);
    if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
      operator_delete((void *)local_330._0_8_,(ulong)(local_330._16_8_ + 1));
    }
    local_3e0 = (FileDescriptor *)0x0;
  }
LAB_001d2a5c:
  if (!bVar28) {
    if (this->pool_->fallback_database_ != (DescriptorDatabase *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->tables_->pending_files_,proto->name_);
      if (0 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_) {
        lVar22 = 0;
        do {
          pTVar2 = this->tables_;
          local_330._0_8_ = *(proto->dependency_).super_RepeatedPtrFieldBase.elements_[lVar22];
          cVar29 = std::tr1::
                   _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                   ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                           *)&pTVar2->files_by_name_,(key_type *)local_330);
          if ((cVar29.
               super__Hashtable_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_false>
               ._M_cur_node ==
               (pTVar2->files_by_name_).
               super_unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>_>
               .
               super___unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_false>
               .
               super__Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
               ._M_buckets
               [(pTVar2->files_by_name_).
                super_unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>_>
                .
                super___unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_false>
                .
                super__Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ._M_bucket_count]) ||
             (((cVar29.
                super__Hashtable_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_false>
               ._M_cur_node)->_M_v).second == (FileDescriptor *)0x0)) {
            pDVar3 = this->pool_->underlay_;
            if (pDVar3 != (DescriptorPool *)0x0) {
              if ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar22) {
                internal::LogMessage::LogMessage
                          (&local_a0,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                           ,0x338);
                pLVar9 = internal::LogMessage::operator<<
                                   (&local_a0,"CHECK failed: (index) < (size()): ");
                internal::LogFinisher::operator=((LogFinisher *)local_330,pLVar9);
                internal::LogMessage::~LogMessage(&local_a0);
              }
              pFVar10 = DescriptorPool::FindFileByName
                                  (pDVar3,(string *)
                                          (proto->dependency_).super_RepeatedPtrFieldBase.elements_
                                          [lVar22]);
              if (pFVar10 != (FileDescriptor *)0x0) goto LAB_001d2bd2;
            }
            pDVar3 = this->pool_;
            if ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar22) {
              internal::LogMessage::LogMessage
                        (&local_d8,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                         ,0x338);
              pLVar9 = internal::LogMessage::operator<<
                                 (&local_d8,"CHECK failed: (index) < (size()): ");
              internal::LogFinisher::operator=((LogFinisher *)local_330,pLVar9);
              internal::LogMessage::~LogMessage(&local_d8);
            }
            DescriptorPool::TryFindFileInFallbackDatabase
                      (pDVar3,(string *)
                              (proto->dependency_).super_RepeatedPtrFieldBase.elements_[lVar22]);
          }
LAB_001d2bd2:
          lVar22 = lVar22 + 1;
        } while (lVar22 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_);
      }
      pbVar8 = (this->tables_->pending_files_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (this->tables_->pending_files_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar8 + -1;
      pcVar4 = pbVar8[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != &pbVar8[-1].field_2) {
        operator_delete(pcVar4,pbVar8[-1].field_2._M_allocated_capacity + 1);
      }
    }
    DescriptorPool::Tables::AddCheckpoint(this->tables_);
    local_3e0 = (FileDescriptor *)DescriptorPool::Tables::AllocateBytes(this->tables_,0xa0);
    this->file_ = local_3e0;
    if ((proto->_has_bits_[0] & 0x400) == 0) {
      this_01 = SourceCodeInfo::default_instance();
    }
    else {
      this_01 = DescriptorPool::Tables::AllocateMessage<google::protobuf::SourceCodeInfo>
                          (this->tables_,(SourceCodeInfo *)0x0);
      from = proto->source_code_info_;
      if (from == (SourceCodeInfo *)0x0) {
        from = *(SourceCodeInfo **)(FileDescriptorProto::default_instance_ + 0xc0);
      }
      SourceCodeInfo::CopyFrom(this_01,from);
    }
    *(SourceCodeInfo **)(local_3e0 + 0x98) = this_01;
    pFVar11 = DescriptorPool::Tables::AllocateFileTables(this->tables_);
    this->file_tables_ = pFVar11;
    *(FileDescriptorTables **)(this->file_ + 0x90) = pFVar11;
    if ((proto->_has_bits_[0] & 1) == 0) {
      local_330._8_8_ = (string *)0x0;
      local_330._16_8_ = local_330._16_8_ & 0xffffffffffffff00;
      local_368._0_8_ = (pointer)0x28;
      local_3b0._0_8_ = &local_3a0;
      local_330._0_8_ = local_330 + 0x10;
      local_3b0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_3b0,(ulong)local_368);
      local_3a0._M_dataplus._M_p = (pointer)local_368._0_8_;
      (((string *)local_3b0._0_8_)->field_2)._M_allocated_capacity = 0x7263736544656c69;
      builtin_strncpy((char *)((long)&((string *)local_3b0._0_8_)->field_2 + 8),"iptorPro",8);
      (((string *)local_3b0._0_8_)->_M_dataplus)._M_p = (pointer)0x20676e697373694d;
      ((string *)local_3b0._0_8_)->_M_string_length = 0x46203a646c656966;
      (((string *)(local_3b0._0_8_ + 0x20))->_M_dataplus)._M_p = (pointer)0x2e656d616e2e6f74;
      local_3b0._8_8_ = local_368._0_8_;
      *(char *)((long)&(((string *)local_3b0._0_8_)->_M_dataplus)._M_p + local_368._0_8_) = '\0';
      AddError(this,(string *)local_330,&proto->super_Message,OTHER,(string *)local_3b0);
      if ((string *)local_3b0._0_8_ != &local_3a0) {
        operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._M_dataplus._M_p + 1));
      }
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_,(ulong)(local_330._16_8_ + 1));
      }
    }
    psVar12 = DescriptorPool::Tables::AllocateString(this->tables_,proto->name_);
    *(string **)local_3e0 = psVar12;
    if ((proto->_has_bits_[0] & 2) == 0) {
      local_330._8_8_ = (string *)0x0;
      local_330._16_8_ = local_330._16_8_ & 0xffffffffffffff00;
      local_330._0_8_ = local_330 + 0x10;
      psVar12 = DescriptorPool::Tables::AllocateString(this->tables_,(string *)local_330);
      *(string **)(local_3e0 + 8) = psVar12;
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_,(ulong)(local_330._16_8_ + 1));
      }
    }
    else {
      psVar12 = DescriptorPool::Tables::AllocateString(this->tables_,proto->package_);
      *(string **)(local_3e0 + 8) = psVar12;
    }
    *(DescriptorPool **)(local_3e0 + 0x10) = this->pool_;
    bVar28 = DescriptorPool::Tables::AddFile(this->tables_,local_3e0);
    if (bVar28) {
      if ((*(string **)(local_3e0 + 8))->_M_string_length != 0) {
        AddPackage(this,*(string **)(local_3e0 + 8),&proto->super_Message,local_3e0);
      }
      local_220._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_220._M_impl.super__Rb_tree_header._M_header;
      local_220._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_220._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_220._M_impl.super__Rb_tree_header._M_node_count = 0;
      iVar6 = (proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
      *(int *)(local_3e0 + 0x18) = iVar6;
      local_220._M_impl.super__Rb_tree_header._M_header._M_right =
           local_220._M_impl.super__Rb_tree_header._M_header._M_left;
      pvVar13 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar6 << 3);
      *(void **)(local_3e0 + 0x20) = pvVar13;
      if (0 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_) {
        MVar1._vptr_MessageLite = (_func_int **)(local_330 + 0x10);
        lVar22 = 0;
        do {
          pVar30 = std::
                   _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   ::_M_insert_unique<std::__cxx11::string_const&>
                             ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                               *)&local_220,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (proto->dependency_).super_RepeatedPtrFieldBase.elements_[lVar22]);
          if (((undefined1  [16])pVar30 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            psVar12 = proto->name_;
            if ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar22) {
              internal::LogMessage::LogMessage
                        (&local_1f0,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                         ,0x338);
              pLVar9 = internal::LogMessage::operator<<
                                 (&local_1f0,"CHECK failed: (index) < (size()): ");
              internal::LogFinisher::operator=((LogFinisher *)local_368,pLVar9);
              internal::LogMessage::~LogMessage(&local_1f0);
            }
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3b0,"Import \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (proto->dependency_).super_RepeatedPtrFieldBase.elements_[lVar22]);
            puVar14 = (undefined8 *)std::__cxx11::string::append(local_3b0);
            pp_Var19 = (_func_int **)(puVar14 + 2);
            if ((_func_int **)*puVar14 == pp_Var19) {
              local_330._16_8_ = *pp_Var19;
              local_318[0].super_MessageFactory._vptr_MessageFactory = (_func_int **)puVar14[3];
              local_330._0_8_ = MVar1._vptr_MessageLite;
            }
            else {
              local_330._16_8_ = *pp_Var19;
              local_330._0_8_ = (_func_int **)*puVar14;
            }
            local_330._8_8_ = puVar14[1];
            *puVar14 = pp_Var19;
            puVar14[1] = 0;
            *(undefined1 *)(puVar14 + 2) = 0;
            AddError(this,psVar12,&proto->super_Message,OTHER,(string *)local_330);
            if ((_func_int **)local_330._0_8_ != MVar1._vptr_MessageLite) {
              operator_delete((void *)local_330._0_8_,(ulong)(local_330._16_8_ + 1));
            }
            if ((string *)local_3b0._0_8_ != &local_3a0) {
              operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._M_dataplus._M_p + 1));
            }
          }
          pTVar2 = this->tables_;
          if ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar22) {
            internal::LogMessage::LogMessage
                      (&local_68,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                       ,0x338);
            pLVar9 = internal::LogMessage::operator<<
                               (&local_68,"CHECK failed: (index) < (size()): ");
            internal::LogFinisher::operator=((LogFinisher *)local_330,pLVar9);
            internal::LogMessage::~LogMessage(&local_68);
          }
          local_330._0_8_ = *(proto->dependency_).super_RepeatedPtrFieldBase.elements_[lVar22];
          cVar29 = std::tr1::
                   _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                   ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                           *)&pTVar2->files_by_name_,(key_type *)local_330);
          if (cVar29.
              super__Hashtable_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_false>
              ._M_cur_node ==
              (pTVar2->files_by_name_).
              super_unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>_>
              .
              super___unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_buckets
              [(pTVar2->files_by_name_).
               super_unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>_>
               .
               super___unordered_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_false>
               .
               super__Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::_Select1st<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
               ._M_bucket_count]) {
            pFVar10 = (FileDescriptor *)0x0;
          }
          else {
            pFVar10 = ((cVar29.
                        super__Hashtable_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_false>
                       ._M_cur_node)->_M_v).second;
          }
          if (pFVar10 == (FileDescriptor *)0x0) {
            pDVar3 = this->pool_->underlay_;
            if (pDVar3 == (DescriptorPool *)0x0) {
              pFVar10 = (FileDescriptor *)0x0;
            }
            else {
              if ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar22) {
                internal::LogMessage::LogMessage
                          (&local_1b8,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                           ,0x338);
                pLVar9 = internal::LogMessage::operator<<
                                   (&local_1b8,"CHECK failed: (index) < (size()): ");
                internal::LogFinisher::operator=((LogFinisher *)local_330,pLVar9);
                internal::LogMessage::~LogMessage(&local_1b8);
              }
              pFVar10 = DescriptorPool::FindFileByName
                                  (pDVar3,(string *)
                                          (proto->dependency_).super_RepeatedPtrFieldBase.elements_
                                          [lVar22]);
            }
          }
          if (pFVar10 == (FileDescriptor *)0x0) {
            if (this->pool_->allow_unknown_ == true) {
              if ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar22) {
                internal::LogMessage::LogMessage
                          (&local_180,LOGLEVEL_DFATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                           ,0x338);
                pLVar9 = internal::LogMessage::operator<<
                                   (&local_180,"CHECK failed: (index) < (size()): ");
                internal::LogFinisher::operator=((LogFinisher *)local_330,pLVar9);
                internal::LogMessage::~LogMessage(&local_180);
              }
              pFVar10 = NewPlaceholderFile(this,(string *)
                                                (proto->dependency_).super_RepeatedPtrFieldBase.
                                                elements_[lVar22]);
            }
            else {
              local_330._8_8_ = (string *)0x0;
              local_330._16_8_ = local_330._16_8_ & 0xffffffffffffff00;
              if (this->pool_->fallback_database_ == (DescriptorDatabase *)0x0) {
                local_330._0_8_ = MVar1._vptr_MessageLite;
                if ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar22) {
                  internal::LogMessage::LogMessage
                            (&local_148,LOGLEVEL_DFATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                             ,0x338);
                  pLVar9 = internal::LogMessage::operator<<
                                     (&local_148,"CHECK failed: (index) < (size()): ");
                  internal::LogFinisher::operator=((LogFinisher *)&local_258,pLVar9);
                  internal::LogMessage::~LogMessage(&local_148);
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_368,"Import \"",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (proto->dependency_).super_RepeatedPtrFieldBase.elements_[lVar22]);
                plVar15 = (long *)std::__cxx11::string::append(local_368);
              }
              else {
                local_330._0_8_ = MVar1._vptr_MessageLite;
                if ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= lVar22) {
                  internal::LogMessage::LogMessage
                            (&local_110,LOGLEVEL_DFATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                             ,0x338);
                  pLVar9 = internal::LogMessage::operator<<
                                     (&local_110,"CHECK failed: (index) < (size()): ");
                  internal::LogFinisher::operator=((LogFinisher *)&local_258,pLVar9);
                  internal::LogMessage::~LogMessage(&local_110);
                }
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_368,"Import \"",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (proto->dependency_).super_RepeatedPtrFieldBase.elements_[lVar22]);
                plVar15 = (long *)std::__cxx11::string::append(local_368);
              }
              psVar12 = (string *)(plVar15 + 2);
              if ((string *)*plVar15 == psVar12) {
                local_3a0._M_dataplus._M_p = (psVar12->_M_dataplus)._M_p;
                local_3a0._M_string_length = plVar15[3];
                local_3b0._0_8_ = &local_3a0;
              }
              else {
                local_3a0._M_dataplus._M_p = (psVar12->_M_dataplus)._M_p;
                local_3b0._0_8_ = (string *)*plVar15;
              }
              local_3b0._8_8_ = plVar15[1];
              *plVar15 = (long)psVar12;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              std::__cxx11::string::operator=((string *)local_330,(string *)local_3b0);
              if ((string *)local_3b0._0_8_ != &local_3a0) {
                operator_delete((void *)local_3b0._0_8_,(ulong)(local_3a0._M_dataplus._M_p + 1));
              }
              if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
                operator_delete((void *)local_368._0_8_,local_368._16_8_ + 1);
              }
              AddError(this,proto->name_,&proto->super_Message,OTHER,(string *)local_330);
              if ((_func_int **)local_330._0_8_ != MVar1._vptr_MessageLite) {
                operator_delete((void *)local_330._0_8_,(ulong)(local_330._16_8_ + 1));
              }
              pFVar10 = (FileDescriptor *)0x0;
            }
          }
          *(FileDescriptor **)(*(long *)(local_3e0 + 0x20) + lVar22 * 8) = pFVar10;
          lVar22 = lVar22 + 1;
        } while (lVar22 < (proto->dependency_).super_RepeatedPtrFieldBase.current_size_);
      }
      pvVar13 = DescriptorPool::Tables::AllocateBytes
                          (this->tables_,(proto->public_dependency_).current_size_ << 2);
      *(void **)(local_3e0 + 0x30) = pvVar13;
      if ((proto->public_dependency_).current_size_ < 1) {
        iVar6 = 0;
      }
      else {
        lVar22 = 0;
        iVar6 = 0;
        do {
          iVar21 = (proto->public_dependency_).elements_[lVar22];
          if ((iVar21 < 0) ||
             ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar21)) {
            psVar12 = proto->name_;
            local_3b0._0_8_ = (string *)0x20;
            local_330._0_8_ = local_330 + 0x10;
            local_330._0_8_ = std::__cxx11::string::_M_create((ulong *)local_330,(ulong)local_3b0);
            local_330._16_8_ = local_3b0._0_8_;
            *(undefined8 *)(local_330._0_8_ + 0x10) = 0x636e65646e657065;
            *(undefined8 *)(local_330._0_8_ + 0x18) = 0x2e7865646e692079;
            *(undefined8 *)local_330._0_8_ = 0x2064696c61766e49;
            *(undefined8 *)(local_330._0_8_ + 8) = 0x642063696c627570;
            local_330._8_8_ = local_3b0._0_8_;
            *(char *)(local_330._0_8_ + local_3b0._0_8_) = '\0';
            AddError(this,psVar12,&proto->super_Message,OTHER,(string *)local_330);
            if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
              operator_delete((void *)local_330._0_8_,(ulong)(local_330._16_8_ + 1));
            }
          }
          else {
            lVar20 = (long)iVar6;
            iVar6 = iVar6 + 1;
            *(int *)(*(long *)(local_3e0 + 0x30) + lVar20 * 4) = iVar21;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 < (proto->public_dependency_).current_size_);
      }
      *(int *)(local_3e0 + 0x28) = iVar6;
      std::
      _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::clear(&(this->dependencies_)._M_t);
      if (0 < *(int *)(local_3e0 + 0x18)) {
        lVar22 = 0;
        do {
          RecordPublicDependencies
                    (this,*(FileDescriptor **)(*(long *)(local_3e0 + 0x20) + lVar22 * 8));
          lVar22 = lVar22 + 1;
        } while (lVar22 < *(int *)(local_3e0 + 0x18));
      }
      pvVar13 = DescriptorPool::Tables::AllocateBytes
                          (this->tables_,(proto->weak_dependency_).current_size_ << 2);
      *(void **)(local_3e0 + 0x40) = pvVar13;
      if ((proto->weak_dependency_).current_size_ < 1) {
        iVar6 = 0;
      }
      else {
        lVar22 = 0;
        iVar6 = 0;
        do {
          iVar21 = (proto->weak_dependency_).elements_[lVar22];
          if ((iVar21 < 0) ||
             ((proto->dependency_).super_RepeatedPtrFieldBase.current_size_ <= iVar21)) {
            psVar12 = proto->name_;
            local_3b0._0_8_ = (string *)0x1e;
            local_330._0_8_ = local_330 + 0x10;
            local_330._0_8_ = std::__cxx11::string::_M_create((ulong *)local_330,(ulong)local_3b0);
            local_330._16_8_ = local_3b0._0_8_;
            builtin_strncpy((char *)(local_330._0_8_ + 0xe),"ependenc",8);
            builtin_strncpy((char *)(local_330._0_8_ + 0x16),"y index.",8);
            *(undefined8 *)local_330._0_8_ = 0x2064696c61766e49;
            *(undefined8 *)(local_330._0_8_ + 8) = 0x706564206b616577;
            local_330._8_8_ = local_3b0._0_8_;
            *(char *)(local_330._0_8_ + local_3b0._0_8_) = '\0';
            AddError(this,psVar12,&proto->super_Message,OTHER,(string *)local_330);
            if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
              operator_delete((void *)local_330._0_8_,(ulong)(local_330._16_8_ + 1));
            }
          }
          else {
            lVar20 = (long)iVar6;
            iVar6 = iVar6 + 1;
            *(int *)(*(long *)(local_3e0 + 0x40) + lVar20 * 4) = iVar21;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 < (proto->weak_dependency_).current_size_);
      }
      *(int *)(local_3e0 + 0x38) = iVar6;
      iVar6 = (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
      *(int *)(local_3e0 + 0x48) = iVar6;
      pvVar13 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar6 * 0x78);
      *(void **)(local_3e0 + 0x50) = pvVar13;
      if (0 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_) {
        lVar22 = 0;
        lVar20 = 0;
        do {
          BuildMessage(this,(DescriptorProto *)
                            (proto->message_type_).super_RepeatedPtrFieldBase.elements_[lVar20],
                       (Descriptor *)0x0,(Descriptor *)(*(long *)(local_3e0 + 0x50) + lVar22));
          lVar20 = lVar20 + 1;
          lVar22 = lVar22 + 0x78;
        } while (lVar20 < (proto->message_type_).super_RepeatedPtrFieldBase.current_size_);
      }
      iVar6 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
      *(int *)(local_3e0 + 0x58) = iVar6;
      pvVar13 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar6 * 0x38);
      *(void **)(local_3e0 + 0x60) = pvVar13;
      if (0 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
        lVar22 = 0;
        lVar20 = 0;
        do {
          BuildEnum(this,(EnumDescriptorProto *)
                         (proto->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar20],
                    (Descriptor *)0x0,(EnumDescriptor *)(*(long *)(local_3e0 + 0x60) + lVar22));
          lVar20 = lVar20 + 1;
          lVar22 = lVar22 + 0x38;
        } while (lVar20 < (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_);
      }
      iVar6 = (proto->service_).super_RepeatedPtrFieldBase.current_size_;
      *(int *)(local_3e0 + 0x68) = iVar6;
      pvVar13 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar6 * 0x30);
      *(void **)(local_3e0 + 0x70) = pvVar13;
      if (0 < (proto->service_).super_RepeatedPtrFieldBase.current_size_) {
        lVar22 = 0;
        lVar20 = 0;
        pvVar13 = extraout_RDX;
        do {
          BuildService(this,(ServiceDescriptorProto *)
                            (proto->service_).super_RepeatedPtrFieldBase.elements_[lVar20],pvVar13,
                       (ServiceDescriptor *)(*(long *)(local_3e0 + 0x70) + lVar22));
          lVar20 = lVar20 + 1;
          lVar22 = lVar22 + 0x30;
          pvVar13 = extraout_RDX_00;
        } while (lVar20 < (proto->service_).super_RepeatedPtrFieldBase.current_size_);
      }
      iVar6 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
      *(int *)(local_3e0 + 0x78) = iVar6;
      pvVar13 = DescriptorPool::Tables::AllocateBytes(this->tables_,iVar6 * 0x78);
      *(void **)(local_3e0 + 0x80) = pvVar13;
      if (0 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_) {
        lVar22 = 0;
        lVar20 = 0;
        do {
          BuildFieldOrExtension
                    (this,(FieldDescriptorProto *)
                          (proto->extension_).super_RepeatedPtrFieldBase.elements_[lVar20],
                     (Descriptor *)0x0,(FieldDescriptor *)(*(long *)(local_3e0 + 0x80) + lVar22),
                     true);
          lVar20 = lVar20 + 1;
          lVar22 = lVar22 + 0x78;
        } while (lVar20 < (proto->extension_).super_RepeatedPtrFieldBase.current_size_);
      }
      if ((proto->_has_bits_[0] & 0x200) == 0) {
        *(undefined8 *)(local_3e0 + 0x88) = 0;
      }
      else {
        orig_options = proto->options_;
        if (orig_options == (FileOptions *)0x0) {
          orig_options = *(FileOptions **)(FileDescriptorProto::default_instance_ + 0xb8);
        }
        AllocateOptions(this,orig_options,local_3e0);
      }
      CrossLinkFile(this,local_3e0,proto);
      if (this->had_errors_ == false) {
        OptionInterpreter::OptionInterpreter((OptionInterpreter *)local_330,this);
        pOVar16 = (this->options_to_interpret_).
                  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pOVar24 = (this->options_to_interpret_).
                  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (pOVar16 != pOVar24) {
          do {
            paVar26 = &local_3d0.field_2;
            pMVar5 = pOVar16->original_options;
            this_00 = &pOVar16->options->super_MessageLite;
            local_370 = pOVar16;
            local_330._8_8_ = pOVar16;
            iVar6 = (*this_00->_vptr_MessageLite[0x13])(this_00);
            local_378 = 0x14;
            local_3d0._M_dataplus._M_p = (pointer)paVar26;
            local_3d0._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_3d0,(ulong)&local_378);
            local_3d0.field_2._M_allocated_capacity = local_378;
            builtin_strncpy(local_3d0._M_dataplus._M_p,"uninterpreted_option",0x14);
            local_3d0._M_string_length = local_378;
            local_3d0._M_dataplus._M_p[local_378] = '\0';
            pFVar17 = Descriptor::FindFieldByName
                                ((Descriptor *)CONCAT44(extraout_var,iVar6),&local_3d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0._M_dataplus._M_p != paVar26) {
              operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1
                             );
            }
            if (pFVar17 == (FieldDescriptor *)0x0) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_3b0,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                         ,0x10aa);
              pLVar9 = internal::LogMessage::operator<<
                                 ((LogMessage *)local_3b0,
                                  "CHECK failed: uninterpreted_options_field != NULL: ");
              pLVar9 = internal::LogMessage::operator<<
                                 (pLVar9,
                                  "No field named \"uninterpreted_option\" in the Options proto.");
              internal::LogFinisher::operator=((LogFinisher *)&local_3d0,pLVar9);
              internal::LogMessage::~LogMessage((LogMessage *)local_3b0);
            }
            iVar6 = (*this_00->_vptr_MessageLite[0x12])(this_00);
            (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x38))
                      ((long *)CONCAT44(extraout_var_00,iVar6),this_00,pFVar17);
            iVar6 = (*(pMVar5->super_MessageLite)._vptr_MessageLite[0x13])(pMVar5);
            local_378 = 0x14;
            local_3d0._M_dataplus._M_p = (pointer)paVar26;
            local_3d0._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_3d0,(ulong)&local_378);
            local_3d0.field_2._M_allocated_capacity = local_378;
            *(undefined8 *)local_3d0._M_dataplus._M_p = 0x707265746e696e75;
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d0._M_dataplus._M_p + 8) = 'r';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d0._M_dataplus._M_p + 9) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d0._M_dataplus._M_p + 10) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d0._M_dataplus._M_p + 0xb) = 'e';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d0._M_dataplus._M_p + 0xc) = 'd';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d0._M_dataplus._M_p + 0xd) = '_';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d0._M_dataplus._M_p + 0xe) = 'o';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d0._M_dataplus._M_p + 0xf) = 'p';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d0._M_dataplus._M_p + 0x10) = 't';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d0._M_dataplus._M_p + 0x11) = 'i';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d0._M_dataplus._M_p + 0x12) = 'o';
            *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d0._M_dataplus._M_p + 0x13) = 'n';
            local_3d0._M_string_length = local_378;
            local_3d0._M_dataplus._M_p[local_378] = '\0';
            pFVar17 = Descriptor::FindFieldByName
                                ((Descriptor *)CONCAT44(extraout_var_01,iVar6),&local_3d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0._M_dataplus._M_p != paVar26) {
              operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1
                             );
            }
            if (pFVar17 == (FieldDescriptor *)0x0) {
              internal::LogMessage::LogMessage
                        ((LogMessage *)local_368,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                         ,0x10b2);
              pLVar9 = internal::LogMessage::operator<<
                                 ((LogMessage *)local_368,
                                  "CHECK failed: original_uninterpreted_options_field != NULL: ");
              pLVar9 = internal::LogMessage::operator<<
                                 (pLVar9,
                                  "No field named \"uninterpreted_option\" in the Options proto.");
              internal::LogFinisher::operator=((LogFinisher *)&local_3d0,pLVar9);
              internal::LogMessage::~LogMessage((LogMessage *)local_368);
            }
            iVar6 = (*(pMVar5->super_MessageLite)._vptr_MessageLite[0x12])(pMVar5);
            iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar6) + 0x30))
                              ((long *)CONCAT44(extraout_var_02,iVar6),pMVar5,pFVar17);
            if (0 < iVar6) {
              iVar21 = 0;
              do {
                iVar7 = (*(pMVar5->super_MessageLite)._vptr_MessageLite[0x12])(pMVar5);
                psVar12 = (string *)
                          (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar7) + 0x160))
                                    ((long *)CONCAT44(extraout_var_03,iVar7),pMVar5,pFVar17,iVar21);
                lVar22 = __dynamic_cast(psVar12,&Message::typeinfo,&UninterpretedOption::typeinfo,0)
                ;
                if (lVar22 == 0) {
                  __assert_fail("f == NULL || dynamic_cast<To>(f) != NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                                ,0x158,
                                "To google::protobuf::internal::down_cast(From *) [To = const google::protobuf::UninterpretedOption *, From = const google::protobuf::Message]"
                               );
                }
                local_330._16_8_ = psVar12;
                bVar28 = OptionInterpreter::InterpretSingleOption
                                   ((OptionInterpreter *)local_330,(Message *)this_00);
                if (!bVar28) {
                  local_330._8_8_ = (string *)0x0;
                  local_330._16_8_ = (string *)0x0;
                  goto LAB_001d3c4c;
                }
                iVar21 = iVar21 + 1;
              } while (iVar6 != iVar21);
            }
            local_330._8_8_ = (string *)0x0;
            local_330._16_8_ = (string *)0x0;
            local_3d0._M_string_length = 0;
            local_3d0.field_2._M_allocated_capacity =
                 local_3d0.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
            MessageLite::AppendToString(this_00,&local_3d0);
            bVar28 = MessageLite::ParseFromString(this_00,&local_3d0);
            if (!bVar28) {
              internal::LogMessage::LogMessage
                        (&local_258,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                         ,0x10d0);
              pLVar9 = internal::LogMessage::operator<<
                                 (&local_258,"CHECK failed: options->ParseFromString(buf): ");
              pLVar9 = internal::LogMessage::operator<<
                                 (pLVar9,"Protocol message serialized itself in invalid fashion.");
              internal::LogFinisher::operator=((LogFinisher *)&local_378,pLVar9);
              if (!bVar28) {
                internal::LogMessage::~LogMessage(&local_258);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
              operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1
                             );
            }
LAB_001d3c4c:
            pOVar16 = local_370 + 1;
            pOVar24 = (this->options_to_interpret_).
                      super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          } while (pOVar16 != pOVar24);
        }
        pOVar16 = (this->options_to_interpret_).
                  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pOVar24 != pOVar16) {
          paVar26 = &(pOVar16->element_name).field_2;
          do {
            plVar15 = (long *)(((string *)(paVar26 + -1))->_M_dataplus)._M_p;
            if (paVar26 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar15) {
              operator_delete(plVar15,paVar26->_M_allocated_capacity + 1);
            }
            if (paVar26 + -2 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)paVar26[-3]._M_allocated_capacity) {
              operator_delete((long *)paVar26[-3]._M_allocated_capacity,
                              paVar26[-2]._M_allocated_capacity + 1);
            }
            pOVar27 = (pointer)(paVar26 + 2);
            paVar26 = paVar26 + 5;
          } while (pOVar27 != pOVar24);
          (this->options_to_interpret_).
          super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
          ._M_impl.super__Vector_impl_data._M_finish = pOVar16;
        }
        DynamicMessageFactory::~DynamicMessageFactory(local_318);
      }
      if (this->had_errors_ == false) {
        ValidateFileOptions(this,local_3e0,proto);
      }
      if (this->had_errors_ == true) {
        DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
        local_3e0 = (FileDescriptor *)0x0;
      }
      else {
        DescriptorPool::Tables::ClearLastCheckpoint(this->tables_);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_220);
    }
    else {
      psVar12 = proto->name_;
      local_3b0._0_8_ = (string *)0x2d;
      local_330._0_8_ = local_330 + 0x10;
      local_330._0_8_ = std::__cxx11::string::_M_create((ulong *)local_330,(ulong)local_3b0);
      local_330._16_8_ = local_3b0._0_8_;
      builtin_strncpy((char *)(local_330._0_8_ + 0x1d),"ady in t",8);
      builtin_strncpy((char *)(local_330._0_8_ + 0x25),"he pool.",8);
      *(undefined8 *)(local_330._0_8_ + 0x10) = 0x736920656d616e20;
      *(undefined8 *)(local_330._0_8_ + 0x18) = 0x79646165726c6120;
      *(undefined8 *)local_330._0_8_ = 0x7720656c69662041;
      *(undefined8 *)(local_330._0_8_ + 8) = 0x7369687420687469;
      local_330._8_8_ = local_3b0._0_8_;
      *(char *)(local_330._0_8_ + local_3b0._0_8_) = '\0';
      AddError(this,psVar12,&proto->super_Message,OTHER,(string *)local_330);
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_,(ulong)(local_330._16_8_ + 1));
      }
      DescriptorPool::Tables::RollbackToLastCheckpoint(this->tables_);
      local_3e0 = (FileDescriptor *)0x0;
    }
  }
  return local_3e0;
LAB_001d290b:
  uVar25 = uVar25 + 1;
  bVar28 = uVar25 < uVar23;
  lVar22 = lVar22 + 0x20;
  if (uVar23 + (uVar23 == 0) == uVar25) goto LAB_001d2a5c;
  goto LAB_001d28db;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accomodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != NULL) {
    // File already in pool.  Compare the existing one to the input.
    FileDescriptorProto existing_proto;
    existing_file->CopyTo(&existing_proto);
    if (existing_proto.SerializeAsString() == proto.SerializeAsString()) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO(kenton):  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (int i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      string error_message("File recursively imports itself: ");
      for (; i < tables_->pending_files_.size(); i++) {
        error_message.append(tables_->pending_files_[i]);
        error_message.append(" -> ");
      }
      error_message.append(proto.name());

      AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
               error_message);
      return NULL;
    }
  }

  // If we have a fallback_database_, attempt to load all dependencies now,
  // before checkpointing tables_.  This avoids confusion with recursive
  // checkpoints.
  if (pool_->fallback_database_ != NULL) {
    tables_->pending_files_.push_back(proto.name());
    for (int i = 0; i < proto.dependency_size(); i++) {
      if (tables_->FindFile(proto.dependency(i)) == NULL &&
          (pool_->underlay_ == NULL ||
           pool_->underlay_->FindFileByName(proto.dependency(i)) == NULL)) {
        // We don't care what this returns since we'll find out below anyway.
        pool_->TryFindFileInFallbackDatabase(proto.dependency(i));
      }
    }
    tables_->pending_files_.pop_back();
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = tables_->Allocate<FileDescriptor>();
  file_ = result;

  if (proto.has_source_code_info()) {
    SourceCodeInfo *info = tables_->AllocateMessage<SourceCodeInfo>();
    info->CopyFrom(proto.source_code_info());
    result->source_code_info_ = info;
  } else {
    result->source_code_info_ = &SourceCodeInfo::default_instance();
  }

  file_tables_ = tables_->AllocateFileTables();
  file_->tables_ = file_tables_;

  if (!proto.has_name()) {
    AddError("", proto, DescriptorPool::ErrorCollector::OTHER,
             "Missing field: FileDescriptorProto.name.");
  }

  result->name_ = tables_->AllocateString(proto.name());
  if (proto.has_package()) {
    result->package_ = tables_->AllocateString(proto.package());
  } else {
    // We cannot rely on proto.package() returning a valid string if
    // proto.has_package() is false, because we might be running at static
    // initialization time, in which case default values have not yet been
    // initialized.
    result->package_ = tables_->AllocateString("");
  }
  result->pool_ = pool_;

  // Add to tables.
  if (!tables_->AddFile(result)) {
    AddError(proto.name(), proto, DescriptorPool::ErrorCollector::OTHER,
             "A file with this name is already in the pool.");
    // Bail out early so that if this is actually the exact same file, we
    // don't end up reporting that every single symbol is already defined.
    tables_->RollbackToLastCheckpoint();
    return NULL;
  }
  if (!result->package().empty()) {
    AddPackage(result->package(), proto, result);
  }

  // Make sure all dependencies are loaded.
  set<string> seen_dependencies;
  result->dependency_count_ = proto.dependency_size();
  result->dependencies_ =
    tables_->AllocateArray<const FileDescriptor*>(proto.dependency_size());
  for (int i = 0; i < proto.dependency_size(); i++) {
    if (!seen_dependencies.insert(proto.dependency(i)).second) {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Import \"" + proto.dependency(i) + "\" was listed twice.");
    }

    const FileDescriptor* dependency = tables_->FindFile(proto.dependency(i));
    if (dependency == NULL && pool_->underlay_ != NULL) {
      dependency = pool_->underlay_->FindFileByName(proto.dependency(i));
    }

    if (dependency == NULL) {
      if (pool_->allow_unknown_) {
        dependency = NewPlaceholderFile(proto.dependency(i));
      } else {
        string message;
        if (pool_->fallback_database_ == NULL) {
          message = "Import \"" + proto.dependency(i) +
                    "\" has not been loaded.";
        } else {
          message = "Import \"" + proto.dependency(i) +
                    "\" was not found or had errors.";
        }
        AddError(proto.name(), proto,
                 DescriptorPool::ErrorCollector::OTHER,
                 message);
      }
    }

    result->dependencies_[i] = dependency;
  }

  // Check public dependencies.
  int public_dependency_count = 0;
  result->public_dependencies_ = tables_->AllocateArray<int>(
      proto.public_dependency_size());
  for (int i = 0; i < proto.public_dependency_size(); i++) {
    // Only put valid public dependency indexes.
    int index = proto.public_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->public_dependencies_[public_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Invalid public dependency index.");
    }
  }
  result->public_dependency_count_ = public_dependency_count;

  // Build dependency set
  dependencies_.clear();
  for (int i = 0; i < result->dependency_count(); i++) {
    RecordPublicDependencies(result->dependency(i));
  }

  // Check weak dependencies.
  int weak_dependency_count = 0;
  result->weak_dependencies_ = tables_->AllocateArray<int>(
      proto.weak_dependency_size());
  for (int i = 0; i < proto.weak_dependency_size(); i++) {
    int index = proto.weak_dependency(i);
    if (index >= 0 && index < proto.dependency_size()) {
      result->weak_dependencies_[weak_dependency_count++] = index;
    } else {
      AddError(proto.name(), proto,
               DescriptorPool::ErrorCollector::OTHER,
               "Invalid weak dependency index.");
    }
  }
  result->weak_dependency_count_ = weak_dependency_count;

  // Convert children.
  BUILD_ARRAY(proto, result, message_type, BuildMessage  , NULL);
  BUILD_ARRAY(proto, result, enum_type   , BuildEnum     , NULL);
  BUILD_ARRAY(proto, result, service     , BuildService  , NULL);
  BUILD_ARRAY(proto, result, extension   , BuildExtension, NULL);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  // Note that the following steps must occur in exactly the specified order.

  // Cross-link.
  CrossLinkFile(result, proto);

  // Interpret any remaining uninterpreted options gathered into
  // options_to_interpret_ during descriptor building.  Cross-linking has made
  // extension options known, so all interpretations should now succeed.
  if (!had_errors_) {
    OptionInterpreter option_interpreter(this);
    for (vector<OptionsToInterpret>::iterator iter =
             options_to_interpret_.begin();
         iter != options_to_interpret_.end(); ++iter) {
      option_interpreter.InterpretOptions(&(*iter));
    }
    options_to_interpret_.clear();
  }

  // Validate options.
  if (!had_errors_) {
    ValidateFileOptions(result, proto);
  }

  if (had_errors_) {
    tables_->RollbackToLastCheckpoint();
    return NULL;
  } else {
    tables_->ClearLastCheckpoint();
    return result;
  }
}